

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode UA_Client_disconnect(UA_Client *client)

{
  UA_Connection *pUVar1;
  UA_Boolean UVar2;
  UA_StatusCode UVar3;
  UA_StatusCode UVar4;
  UA_StatusCode UVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auStack_178 [8];
  UA_CloseSessionRequest request;
  undefined1 auStack_f8 [8];
  timeval tv;
  undefined4 local_64;
  uint local_60;
  UA_SecureConversationMessageHeader msgHeader;
  UA_SequenceHeader seqHeader;
  UA_SymmetricAlgorithmSecurityHeader symHeader;
  UA_ByteString local_40;
  
  if (client->state == UA_CLIENTSTATE_READY) {
    UVar3 = 0x808a0000;
  }
  else {
    UVar3 = 0;
    if ((client->connection).state == UA_CONNECTION_ESTABLISHED) {
      UVar2 = UA_NodeId_equal(&client->authenticationToken,&UA_NODEID_NULL);
      uVar6 = 0;
      if (!UVar2) {
        request.requestHeader.additionalHeader.content._16_8_ = 0;
        request.requestHeader.additionalHeader.content.encoded.body.length = 0;
        request.requestHeader.additionalHeader.content.decoded.type = (UA_DataType *)0x0;
        request.requestHeader.additionalHeader.content.decoded.data = (void *)0x0;
        request.requestHeader.timeoutHint = 0;
        request.requestHeader._60_4_ = 0;
        request.requestHeader.additionalHeader.encoding = UA_EXTENSIONOBJECT_ENCODED_NOBODY;
        request.requestHeader.additionalHeader._4_4_ = 0;
        request.requestHeader.auditEntryId.length = 0;
        request.requestHeader.auditEntryId.data = (UA_Byte *)0x0;
        request.requestHeader.timestamp = 0;
        request.requestHeader.requestHandle = 0;
        request.requestHeader.returnDiagnostics = 0;
        request.requestHeader.authenticationToken.identifier.string.length = 0;
        request.requestHeader.authenticationToken.identifier.string.data = (UA_Byte *)0x0;
        auStack_178._0_2_ = 0;
        auStack_178._2_2_ = 0;
        auStack_178._4_4_ = 0;
        request.requestHeader.authenticationToken.namespaceIndex = 0;
        request.requestHeader.authenticationToken._2_2_ = 0;
        request.requestHeader.authenticationToken.identifierType = UA_NODEIDTYPE_NUMERIC;
        request.requestHeader.additionalHeader.content.encoded.body.data = (UA_Byte *)0x0;
        gettimeofday((timeval *)auStack_f8,(__timezone_ptr_t)0x0);
        request.requestHeader.authenticationToken.identifier.string.data =
             (UA_Byte *)((long)auStack_f8 * 10000000 + 0x19db1ded53e8000 + tv.tv_sec * 10);
        request.requestHeader.auditEntryId.data =
             (UA_Byte *)CONCAT44(request.requestHeader.auditEntryId.data._4_4_,10000);
        request.requestHeader.additionalHeader.content._32_1_ = 1;
        __UA_Client_Service(client,auStack_178,UA_TYPES + 99,auStack_f8,UA_TYPES + 0x8e);
        deleteMembers_noInit(auStack_178,UA_TYPES + 99);
        request.requestHeader.additionalHeader.content.encoded.body.data = (UA_Byte *)0x0;
        request.requestHeader.additionalHeader.content._16_8_ = 0;
        request.requestHeader.additionalHeader.content.encoded.body.length = 0;
        request.requestHeader.additionalHeader.content.decoded.type = (UA_DataType *)0x0;
        request.requestHeader.additionalHeader.content.decoded.data = (void *)0x0;
        request.requestHeader.timeoutHint = 0;
        request.requestHeader._60_4_ = 0;
        request.requestHeader.additionalHeader.encoding = UA_EXTENSIONOBJECT_ENCODED_NOBODY;
        request.requestHeader.additionalHeader._4_4_ = 0;
        request.requestHeader.auditEntryId.length = 0;
        request.requestHeader.auditEntryId.data = (UA_Byte *)0x0;
        request.requestHeader.timestamp = 0;
        request.requestHeader.requestHandle = 0;
        request.requestHeader.returnDiagnostics = 0;
        request.requestHeader.authenticationToken.identifier.string.length = 0;
        request.requestHeader.authenticationToken.identifier.string.data = (UA_Byte *)0x0;
        auStack_178._0_2_ = 0;
        auStack_178._2_2_ = 0;
        auStack_178._4_4_ = 0;
        request.requestHeader.authenticationToken.namespaceIndex = 0;
        request.requestHeader.authenticationToken._2_2_ = 0;
        request.requestHeader.authenticationToken.identifierType = UA_NODEIDTYPE_NUMERIC;
        deleteMembers_noInit(auStack_f8,UA_TYPES + 0x8e);
        uVar6 = tv.tv_sec._4_4_;
        if ((client->connection).state != UA_CONNECTION_ESTABLISHED) {
          return tv.tv_sec._4_4_;
        }
      }
      pUVar1 = &client->connection;
      tv.tv_usec = 0;
      auStack_f8 = (undefined1  [8])0x0;
      tv.tv_sec = 0;
      client->requestHandle = client->requestHandle + 1;
      gettimeofday((timeval *)auStack_178,(__timezone_ptr_t)0x0);
      UA_copy(&client->authenticationToken,auStack_f8,UA_TYPES + 0x10);
      local_64 = 0x464f4c43;
      msgHeader.messageHeader.messageTypeAndChunkType = (client->channel).securityToken.channelId;
      seqHeader.sequenceNumber = (client->channel).securityToken.tokenId;
      msgHeader.messageHeader.messageSize = (client->channel).sendSequenceNumber + 1;
      (client->channel).sendSequenceNumber = msgHeader.messageHeader.messageSize;
      msgHeader.secureChannelId = client->requestId + 1;
      client->requestId = msgHeader.secureChannelId;
      auStack_178._0_2_ = 0;
      auStack_178._4_4_ = 0;
      request.requestHeader.authenticationToken.namespaceIndex = 0x1c4;
      request.requestHeader.authenticationToken._2_2_ = 0;
      UVar3 = (*(client->connection).getSendBuffer)
                        (pUVar1,(ulong)(client->connection).remoteConf.recvBufferSize,&local_40);
      if (UVar3 == 0) {
        pos = local_40.data + 0xc;
        end = local_40.data + local_40.length;
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = &local_40;
        UVar4 = UA_encodeBinaryInternal(&seqHeader,UA_TRANSPORT + 10);
        end = local_40.data + local_40.length;
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = &local_40;
        UVar5 = UA_encodeBinaryInternal(&msgHeader.messageHeader.messageSize,UA_TRANSPORT + 7);
        end = local_40.data + local_40.length;
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = &local_40;
        seqHeader.requestId = UA_encodeBinaryInternal(auStack_178,UA_TYPES + 0x10);
        end = local_40.data + local_40.length;
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        encodeBuf = &local_40;
        UVar3 = UA_encodeBinaryInternal(auStack_f8,UA_TYPES + 0x1f);
        local_60 = (int)pos - (int)local_40.data;
        uVar7 = UVar3 | seqHeader.requestId;
        pos = local_40.data;
        end = local_40.data + local_40.length;
        encodeBuf = &local_40;
        exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
        exchangeBufferCallbackHandle = (void *)0x0;
        UVar3 = UA_encodeBinaryInternal(&local_64,UA_TRANSPORT + 0xb);
        UVar3 = UVar3 | uVar7 | UVar5 | UVar4;
        if (UVar3 == 0) {
          local_40.length = (size_t)local_60;
          UVar3 = (*(client->connection).send)(pUVar1,&local_40);
        }
        else {
          (*(client->connection).releaseSendBuffer)(pUVar1,&local_40);
        }
        (*(client->connection).close)(pUVar1);
      }
      UVar3 = uVar6 | UVar3;
      deleteMembers_noInit(auStack_f8,UA_TYPES + 0x1f);
    }
  }
  return UVar3;
}

Assistant:

UA_StatusCode UA_Client_disconnect(UA_Client *client) {
    if(client->state == UA_CLIENTSTATE_READY)
        return UA_STATUSCODE_BADNOTCONNECTED;
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    /* Is a session established? */
    if(client->connection.state == UA_CONNECTION_ESTABLISHED &&
       !UA_NodeId_equal(&client->authenticationToken, &UA_NODEID_NULL))
        retval = CloseSession(client);
    /* Is a secure channel established? */
    if(client->connection.state == UA_CONNECTION_ESTABLISHED)
        retval |= CloseSecureChannel(client);
    return retval;
}